

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

bool __thiscall
docopt::LeafPattern::match
          (LeafPattern *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  __first;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_00;
  bool bVar1;
  value *pvVar2;
  long lVar3;
  element_type *peVar4;
  undefined8 in_RSI;
  LeafPattern *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val_1;
  long val;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  same_name;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> match;
  value *in_stack_fffffffffffffcd8;
  LeafPattern *in_stack_fffffffffffffce0;
  value_type *in_stack_fffffffffffffce8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  iterator in_stack_fffffffffffffcf0;
  const_iterator in_stack_fffffffffffffcf8;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd20;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  const_iterator in_stack_fffffffffffffd38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130 [6];
  shared_ptr<docopt::LeafPattern> *local_a0;
  long local_98;
  shared_ptr<docopt::LeafPattern> *local_88;
  shared_ptr<docopt::LeafPattern> *local_80;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_78;
  shared_ptr<docopt::Pattern> *local_70;
  shared_ptr<docopt::Pattern> *local_58;
  shared_ptr<docopt::Pattern> *local_50;
  undefined4 local_3c;
  undefined1 local_38 [8];
  __shared_ptr local_30 [47];
  byte local_1;
  
  (*(in_RDI->super_Pattern)._vptr_Pattern[8])(local_38,in_RDI,in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    local_58 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)in_stack_fffffffffffffcd8);
    local_50 = (shared_ptr<docopt::Pattern> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
               ::operator+((__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                            *)in_stack_fffffffffffffce8,(difference_type)in_stack_fffffffffffffce0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
    ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
              ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                *)in_stack_fffffffffffffce0,
               (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                *)in_stack_fffffffffffffcd8);
    local_70 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::erase((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)in_stack_fffffffffffffcf0._M_current,in_stack_fffffffffffffcf8);
    local_80 = (shared_ptr<docopt::LeafPattern> *)
               std::
               vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ::begin((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                        *)in_stack_fffffffffffffcd8);
    local_88 = (shared_ptr<docopt::LeafPattern> *)
               std::
               vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                      *)in_stack_fffffffffffffcd8);
    __first._M_current._7_1_ = in_stack_fffffffffffffd0f;
    __first._M_current._0_7_ = in_stack_fffffffffffffd08;
    local_78 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::LeafPattern>*,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,docopt::LeafPattern::match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&)const::_lambda(std::shared_ptr<docopt::LeafPattern>const&)_1_>
                         (__first,in_stack_fffffffffffffd00,
                          (anon_class_8_1_8991fb9c_for__M_pred)in_stack_fffffffffffffcf8._M_current)
    ;
    pvVar2 = getValue(in_RDI);
    bVar1 = value::isLong(pvVar2);
    if (bVar1) {
      local_98 = 1;
      local_a0 = (shared_ptr<docopt::LeafPattern> *)
                 std::
                 vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                 ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                        *)in_stack_fffffffffffffcd8);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                          *)in_stack_fffffffffffffce0,
                         (__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                          *)in_stack_fffffffffffffcd8);
      if (bVar1) {
        std::
        vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     *)in_stack_fffffffffffffcf0._M_current,(value_type *)in_stack_fffffffffffffce8)
        ;
        std::__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1be074);
        value::value((value *)in_stack_fffffffffffffce0,(long)in_stack_fffffffffffffcd8);
        setValue(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        value::~value((value *)in_stack_fffffffffffffce0);
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
        ::operator*(&local_78);
        peVar4 = std::
                 __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)in_stack_fffffffffffffce0);
        pvVar2 = getValue(peVar4);
        bVar1 = value::isLong(pvVar2);
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
          ::operator*(&local_78);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)in_stack_fffffffffffffce0);
          getValue(peVar4);
          lVar3 = value::asLong((value *)in_stack_fffffffffffffd38._M_current);
          local_98 = local_98 + lVar3;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
          ::operator*(&local_78);
          std::__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffce0);
          value::value((value *)in_stack_fffffffffffffce0,(long)in_stack_fffffffffffffcd8);
          setValue(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          value::~value((value *)in_stack_fffffffffffffce0);
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
          ::operator*(&local_78);
          std::__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffce0);
          value::value((value *)in_stack_fffffffffffffce0,(long)in_stack_fffffffffffffcd8);
          setValue(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          value::~value((value *)in_stack_fffffffffffffce0);
        }
      }
    }
    else {
      pvVar2 = getValue(in_RDI);
      bVar1 = value::isStringList(pvVar2);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1be2f5);
        peVar4 = std::
                 __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1be302);
        pvVar2 = getValue(peVar4);
        bVar1 = value::isString(pvVar2);
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1be33e);
          getValue(peVar4);
          value::asString_abi_cxx11_((value *)in_stack_fffffffffffffce0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcf0._M_current,in_stack_fffffffffffffce8);
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1be39d);
          in_stack_fffffffffffffd38._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getValue(peVar4)
          ;
          in_stack_fffffffffffffd37 =
               value::isStringList((value *)in_stack_fffffffffffffd38._M_current);
          if ((bool)in_stack_fffffffffffffd37) {
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1be3d3);
            in_stack_fffffffffffffd28._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 getValue(peVar4);
            in_stack_fffffffffffffd20 =
                 value::asStringList_abi_cxx11_((value *)in_stack_fffffffffffffce0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          }
        }
        std::
        vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               *)in_stack_fffffffffffffcd8);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                            *)in_stack_fffffffffffffce0,
                           (__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                            *)in_stack_fffffffffffffcd8);
        if (bVar1) {
          std::
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                       *)in_stack_fffffffffffffcf0._M_current,
                      (value_type *)in_stack_fffffffffffffce8);
          std::__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1be464);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd28._M_current);
          value::value((value *)in_stack_fffffffffffffcf0._M_current,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffce8);
          setValue(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          value::~value((value *)in_stack_fffffffffffffce0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcf0._M_current);
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
          ::operator*(&local_78);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)in_stack_fffffffffffffce0);
          pvVar2 = getValue(peVar4);
          bVar1 = value::isStringList(pvVar2);
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
            ::operator*(&local_78);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)in_stack_fffffffffffffce0);
            getValue(peVar4);
            value::asStringList_abi_cxx11_((value *)in_stack_fffffffffffffce0);
            v = local_130;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcd8);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffce0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcd8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcd8);
            __first_00._M_current._7_1_ = in_stack_fffffffffffffd37;
            __first_00._M_current._0_7_ = in_stack_fffffffffffffd30;
            in_stack_fffffffffffffcf0 =
                 std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd38,__first_00,
                            in_stack_fffffffffffffd28);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
            ::operator*(&local_78);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)in_stack_fffffffffffffce0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd28._M_current);
            value::value((value *)in_stack_fffffffffffffcf0._M_current,v);
            setValue(peVar4,in_stack_fffffffffffffcd8);
            value::~value((value *)peVar4);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcf0._M_current);
          }
          else {
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
            ::operator*(&local_78);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)in_stack_fffffffffffffce0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd28._M_current);
            value::value((value *)in_stack_fffffffffffffcf0._M_current,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffce8);
            setValue(in_stack_fffffffffffffce0,(value *)peVar4);
            value::~value((value *)in_stack_fffffffffffffce0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcf0._M_current);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcf0._M_current);
      }
      else {
        std::
        vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     *)in_stack_fffffffffffffcf0._M_current,(value_type *)in_stack_fffffffffffffce8)
        ;
      }
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_3c = 1;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::~pair
            ((pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)0x1be800);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool LeafPattern::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		auto match = single_match(left);
		if (!match.second) {
			return false;
		}

		left.erase(left.begin()+static_cast<std::ptrdiff_t>(match.first));

		auto same_name = std::find_if(collected.begin(), collected.end(), [&](std::shared_ptr<LeafPattern> const& p) {
			return p->name()==name();
		});
		if (getValue().isLong()) {
			long val = 1;
			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isLong()) {
				val += (**same_name).getValue().asLong();
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else if (getValue().isStringList()) {
			std::vector<std::string> val;
			if (match.second->getValue().isString()) {
				val.push_back(match.second->getValue().asString());
			} else if (match.second->getValue().isStringList()) {
				val = match.second->getValue().asStringList();
			} else {
				/// cant be!?
			}

			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isStringList()) {
				std::vector<std::string> const& list = (**same_name).getValue().asStringList();
				val.insert(val.begin(), list.begin(), list.end());
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else {
			collected.push_back(match.second);
		}
		return true;
	}